

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVirtualProtocol.h
# Opt level: O1

uint32_t __thiscall
duckdb_apache::thrift::protocol::
TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
::writeStructBegin_virt
          (TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
           *this,char *name)

{
  uint32_t *__args;
  _func_int **pp_Var1;
  
  __args = &this[3].super_TProtocolDefaults.super_TProtocol.recursion_limit_;
  pp_Var1 = this[3].super_TProtocolDefaults.super_TProtocol._vptr_TProtocol;
  if (pp_Var1 ==
      (_func_int **)
      ((long)&this[3].super_TProtocolDefaults.super_TProtocol.ptrans_.
              super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi[-1]._M_weak_count + 2)) {
    std::deque<short,std::allocator<short>>::_M_push_back_aux<short_const&>
              ((deque<short,std::allocator<short>> *)
               &this[1].super_TProtocolDefaults.super_TProtocol.recursion_limit_,(short *)__args);
  }
  else {
    *(short *)pp_Var1 = (short)this[3].super_TProtocolDefaults.super_TProtocol.recursion_limit_;
    this[3].super_TProtocolDefaults.super_TProtocol._vptr_TProtocol =
         (_func_int **)((long)pp_Var1 + 2);
  }
  *(undefined2 *)__args = 0;
  return 0;
}

Assistant:

uint32_t readI16(int16_t& i16) {
    (void)i16;
    throw TProtocolException(TProtocolException::NOT_IMPLEMENTED,
                             "this protocol does not support reading (yet).");
  }